

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

void __thiscall SocketLog::SocketLog(SocketLog *this)

{
  int iVar1;
  TCPAcceptor *pTVar2;
  SocketLog *this_local;
  
  this->port = 0x1a0a;
  this->acceptor = (TCPAcceptor *)0x0;
  this->inited = false;
  std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::vector(&this->connectedStreams);
  std::mutex::mutex(&this->streamMutex);
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->msgQueue);
  std::mutex::mutex(&this->msgQueueMutex);
  std::condition_variable::condition_variable(&this->msgQueueCondition);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->sendInterceptor,(nullptr_t)0x0);
  signal(0xd,(__sighandler_t)0x1);
  while( true ) {
    pTVar2 = (TCPAcceptor *)operator_new(0x30);
    TCPAcceptor::TCPAcceptor(pTVar2,this->port,"");
    this->acceptor = pTVar2;
    iVar1 = TCPAcceptor::start(this->acceptor);
    if (iVar1 == 0) break;
    printf("SocketLog start failed! check your port:%d",(ulong)(uint)this->port);
    printf("\n");
    this->inited = false;
    pTVar2 = this->acceptor;
    if (pTVar2 != (TCPAcceptor *)0x0) {
      TCPAcceptor::~TCPAcceptor(pTVar2);
      operator_delete(pTVar2);
    }
    this->acceptor = (TCPAcceptor *)0x0;
    this->port = this->port + 1;
  }
  printf("SocketLog start success! port:%d",(ulong)(uint)this->port);
  printf("\n");
  startAcceptThread(this);
  startSendThread(this);
  this->inited = true;
  return;
}

Assistant:

SocketLog::SocketLog() {
    signal(SIGPIPE, SIG_IGN);

    START:
    acceptor = new TCPAcceptor(port);

    if (acceptor->start() == 0) {
        LOG("SocketLog start success! port:%d", port);
        startAcceptThread();
        startSendThread();
        inited = true;
    } else {
        LOGE("SocketLog start failed! check your port:%d", port);
        inited = false;
        delete acceptor;
        acceptor = nullptr;

        port++;
        goto START;
    }
}